

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06b.cpp
# Opt level: O1

string * day6b::recover_message(string *__return_storage_ptr__,string *input)

{
  pair<char,_char> *ppVar1;
  pair<char,_char> *ppVar2;
  long lVar3;
  char cVar4;
  pair<char,_char> pVar5;
  ushort uVar6;
  string *psVar7;
  char *pcVar8;
  istream *piVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  pair<char,_char> *ppVar13;
  char *pcVar14;
  char cVar15;
  size_type sVar16;
  char *pcVar17;
  pair<char,_char> *ppVar18;
  long lVar19;
  long lVar20;
  array<std::pair<char,_char>,_26UL> *letters;
  string line;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  columns;
  istringstream stream;
  allocator_type local_1f1;
  undefined1 *local_1f0;
  size_type local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  string *local_1d0;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  local_1c8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = 0;
  std::operator>>((istream *)local_1b0,(string *)&local_1f0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)local_1e8);
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::vector(&local_1c8,local_1e8,&local_1f1);
  do {
    if (local_1e8 != 0) {
      ppVar13 = (pair<char,_char> *)
                ((long)local_1c8.
                       super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + -0xc2);
      sVar16 = 0;
      do {
        cVar15 = local_1f0[sVar16];
        ppVar13[cVar15].first = cVar15;
        ppVar13[cVar15].second = ppVar13[cVar15].second + '\x01';
        sVar16 = sVar16 + 1;
        ppVar13 = ppVar13 + 0x1a;
      } while (local_1e8 != sVar16);
    }
    piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_1f0);
  } while (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0);
  local_1d0 = __return_storage_ptr__;
  if (local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar14 = &((pair<char,_char> *)
               ((long)local_1c8.
                      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x20))->second;
    lVar20 = 0;
    ppVar13 = (local_1c8.
               super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    do {
      ppVar1 = ppVar13 + 0x1a;
      std::
      __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day6b::recover_message(std::__cxx11::string_const&)::__0>>
                (ppVar13,ppVar1,8);
      lVar10 = 2;
      lVar11 = 2;
      ppVar18 = ppVar13;
      do {
        ppVar2 = ppVar18 + 1;
        if ((ppVar18[1].second == '\0') ||
           (ppVar13->second != '\0' && ppVar13->second <= ppVar18[1].second)) {
          pVar5 = *ppVar2;
          ppVar18 = ppVar2;
          while ((0xff < (ushort)pVar5 &&
                 (cVar15 = ppVar18[-1].second, cVar15 == '\0' || pVar5.second < cVar15))) {
            ppVar18->first = ppVar18[-1].first;
            ppVar18->second = cVar15;
            ppVar18 = ppVar18 + -1;
          }
          ppVar18->first = pVar5.first;
          ppVar18->second = pVar5.second;
        }
        else {
          pVar5 = *ppVar2;
          lVar19 = 0;
          do {
            ppVar18[lVar19 + 1] = ppVar18[lVar19];
            lVar3 = lVar10 + lVar19;
            lVar19 = lVar19 + -1;
          } while (1 < lVar3 + -1);
          ppVar13->first = pVar5.first;
          ppVar13->second = pVar5.second;
        }
        lVar11 = lVar11 + 2;
        lVar10 = lVar10 + 1;
        ppVar18 = ppVar2;
      } while (lVar11 != 0x20);
      lVar10 = 0x20;
      pcVar12 = pcVar14;
      do {
        uVar6 = *(ushort *)(&ppVar13->first + lVar10);
        cVar15 = (char)(uVar6 >> 8);
        pcVar8 = pcVar12;
        if (uVar6 < 0x100) {
          ppVar18 = (pair<char,_char> *)(&ppVar13->first + lVar10);
        }
        else {
          do {
            pcVar17 = pcVar8;
            cVar4 = pcVar17[-2];
            if ((cVar4 != '\0') && (cVar4 <= cVar15)) {
              ppVar18 = (pair<char,_char> *)(pcVar17 + -1);
              goto LAB_0010a193;
            }
            ((pair<char,_char> *)(pcVar17 + -1))->first = pcVar17[-3];
            *pcVar17 = cVar4;
            pcVar8 = pcVar17 + -2;
          } while (0xff < uVar6);
          ppVar18 = (pair<char,_char> *)(pcVar17 + -3);
        }
LAB_0010a193:
        ppVar18->first = (char)uVar6;
        ppVar18->second = cVar15;
        lVar10 = lVar10 + 2;
        pcVar12 = pcVar12 + 2;
      } while (lVar10 != 0x34);
      (local_1d0->_M_dataplus)._M_p[lVar20] = ppVar13->first;
      lVar20 = lVar20 + 1;
      pcVar14 = pcVar14 + 0x34;
      ppVar13 = ppVar1;
    } while (ppVar1 != (local_1c8.
                        super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems);
  }
  if (local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  psVar7 = local_1d0;
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return psVar7;
}

Assistant:

std::string recover_message(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		stream >> line;
		std::string ret(line.size(), ' ');
		std::vector<std::array<std::pair<char, char>, 26>> columns(line.size());
		do {
			int i = 0;
			for(auto c : line) {
				auto& l = columns[i++][c - 'a'];
				l.first = c;
				l.second++;
			}
		} while(stream >> line);

		int i = 0;
		for(auto& letters : columns) {
			std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
				if(a.second == 0) return false;
				if(b.second == 0) return true;
				return a.second < b.second;
			});
			ret[i++] = letters[0].first;
		}
		return ret;
	}